

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masterserver.cpp
# Opt level: O1

int __thiscall CMasterServer::Load(CMasterServer *this)

{
  long lVar1;
  IStorage *pIVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar6;
  long lVar7;
  long in_FS_OFFSET;
  char aAddrStr [48];
  char local_11b8 [128];
  NETADDR local_1138 [2];
  undefined4 local_1108;
  undefined8 local_10f8;
  CLineReader LineReader;
  IOHANDLE IoHandle;
  
  LineReader.m_aBuffer[0x20] = '\0';
  LineReader.m_aBuffer[0x21] = '\0';
  LineReader.m_aBuffer[0x22] = '\0';
  LineReader.m_aBuffer[0x23] = '\0';
  LineReader.m_aBuffer[0x24] = '\0';
  LineReader.m_aBuffer[0x25] = '\0';
  LineReader.m_aBuffer[0x26] = '\0';
  LineReader.m_aBuffer[0x27] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = this->m_pStorage;
  iVar5 = -1;
  if (pIVar2 != (IStorage *)0x0) {
    iVar4 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])(pIVar2,"masters.cfg",9,0,0,0,0,0);
    IoHandle = (IOHANDLE)CONCAT44(extraout_var,iVar4);
    if (IoHandle != (IOHANDLE)0x0) {
      CLineReader::Init(&LineReader,IoHandle);
      memset(local_11b8,0,0x168);
      local_1108 = 2;
      local_10f8 = 0;
      pcVar6 = CLineReader::Get(&LineReader);
      if (pcVar6 != (char *)0x0) {
        do {
          iVar5 = __isoc99_sscanf(pcVar6,"%127s %47s",local_11b8,aAddrStr);
          if ((iVar5 == 2) && (iVar5 = net_addr_from_str(local_1138,aAddrStr), iVar5 == 0)) {
            local_1138[0].port = 0x205b;
            lVar7 = 0x10;
            do {
              pcVar6 = this->m_aMasterServers[0].m_aHostname + lVar7 + -0x10;
              iVar5 = str_comp(pcVar6,local_11b8);
              if (iVar5 == 0) {
                memcpy(pcVar6,local_11b8,0x168);
                bVar3 = true;
                goto LAB_001c5751;
              }
              lVar7 = lVar7 + 0x168;
            } while (lVar7 != 0x5b0);
            bVar3 = false;
LAB_001c5751:
            if (!bVar3) {
              lVar7 = 0x90;
              do {
                if (*(int *)(this->m_aMasterServers[0].m_aHostname + lVar7 + -0x10) == 0) {
                  memcpy((void *)((long)this + lVar7 + -0x80),local_11b8,0x168);
                  bVar3 = true;
                  break;
                }
                lVar7 = lVar7 + 0x168;
              } while (lVar7 != 0x630);
            }
            if (!bVar3) break;
          }
          memset(local_11b8,0,0x168);
          local_1108 = 2;
          local_10f8 = 0;
          pcVar6 = CLineReader::Get(&LineReader);
        } while (pcVar6 != (char *)0x0);
      }
      io_close(IoHandle);
      iVar5 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

virtual int Load()
	{
		if(!m_pStorage)
			return -1;

		// try to open file
		IOHANDLE File = m_pStorage->OpenFile("masters.cfg", IOFLAG_READ | IOFLAG_SKIP_BOM, IStorage::TYPE_SAVE);
		if(!File)
			return -1;

		CLineReader LineReader;
		LineReader.Init(File);
		while(1)
		{
			CMasterInfo Info = {{0}};
			const char *pLine = LineReader.Get();
			if(!pLine)
				break;

			// parse line
			char aAddrStr[NETADDR_MAXSTRSIZE];
			if(sscanf(pLine, "%127s %47s", Info.m_aHostname, aAddrStr) == 2 && net_addr_from_str(&Info.m_Addr, aAddrStr) == 0)
			{
				Info.m_Addr.port = MASTERSERVER_PORT;
				bool Added = false;
				for(int i = 0; i < MAX_MASTERSERVERS; ++i)
					if(str_comp(m_aMasterServers[i].m_aHostname, Info.m_aHostname) == 0)
					{
						m_aMasterServers[i] = Info;
						Added = true;
						break;
					}

				if(!Added)
				{
					for(int i = 0; i < MAX_MASTERSERVERS; ++i)
						if(m_aMasterServers[i].m_Addr.type == NETTYPE_INVALID)
						{
							m_aMasterServers[i] = Info;
							Added = true;
							break;
						}
				}

				if(!Added)
					break;
			}
		}

		io_close(File);
		return 0;
	}